

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_DecryptAes256ByteData_Test::~CryptoUtil_DecryptAes256ByteData_Test
          (CryptoUtil_DecryptAes256ByteData_Test *this)

{
  CryptoUtil_DecryptAes256ByteData_Test *this_local;
  
  ~CryptoUtil_DecryptAes256ByteData_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256ByteData) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData data(
      "752fe203af4a4d427997e5d2c8b246530e0546b66d2982a49e333e77295dccea");
  ByteData result = CryptoUtil::DecryptAes256(key, data);

  EXPECT_STREQ(result.GetHex().c_str(),
      "7465737420746573742074657374207465737400000000000000000000000000");
}